

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv.cpp
# Opt level: O0

dxil_spv_bool
remap_srv(void *userdata,dxil_spv_d3d_binding *binding,dxil_spv_srv_vulkan_binding *vk_binding)

{
  bool bVar1;
  bool bVar2;
  int32_t iVar3;
  undefined1 local_58 [3];
  bool is_global_heap;
  int32_t desc_index;
  Remapper *local_28;
  Remapper *remapper;
  dxil_spv_srv_vulkan_binding *vk_binding_local;
  dxil_spv_d3d_binding *binding_local;
  void *userdata_local;
  
  local_28 = (Remapper *)userdata;
  remapper = (Remapper *)vk_binding;
  vk_binding_local = (dxil_spv_srv_vulkan_binding *)binding;
  binding_local = (dxil_spv_d3d_binding *)userdata;
  memset(local_58,0,0x30);
  memcpy(remapper,local_58,0x30);
  iVar3 = find_root_descriptor_index
                    (local_28,(dxil_spv_d3d_binding *)vk_binding_local,DXIL_SPV_RESOURCE_CLASS_SRV);
  if (iVar3 < 0) {
    bVar1 = d3d_binding_is_global_heap((dxil_spv_d3d_binding *)vk_binding_local);
    if (bVar1) {
      *(undefined1 *)
       &(remapper->root_constants).
        super__Vector_base<Remapper::RootConstant,_std::allocator<Remapper::RootConstant>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = 1;
      *(undefined4 *)
       &(remapper->root_constants).
        super__Vector_base<Remapper::RootConstant,_std::allocator<Remapper::RootConstant>_>._M_impl.
        super__Vector_impl_data._M_start = 0;
      *(undefined4 *)
       ((long)&(remapper->root_constants).
               super__Vector_base<Remapper::RootConstant,_std::allocator<Remapper::RootConstant>_>.
               _M_impl.super__Vector_impl_data._M_start + 4) = 0;
    }
    else if ((local_28->bindless & 1U) == 0) {
      *(undefined1 *)
       &(remapper->root_constants).
        super__Vector_base<Remapper::RootConstant,_std::allocator<Remapper::RootConstant>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = 0;
      *(uint *)&(remapper->root_constants).
                super__Vector_base<Remapper::RootConstant,_std::allocator<Remapper::RootConstant>_>.
                _M_impl.super__Vector_impl_data._M_start =
           (vk_binding_local->buffer_binding).bindless.heap_root_offset;
      *(undefined4 *)
       ((long)&(remapper->root_constants).
               super__Vector_base<Remapper::RootConstant,_std::allocator<Remapper::RootConstant>_>.
               _M_impl.super__Vector_impl_data._M_start + 4) =
           *(undefined4 *)&(vk_binding_local->buffer_binding).bindless.use_heap;
    }
    else {
      *(undefined1 *)
       &(remapper->root_constants).
        super__Vector_base<Remapper::RootConstant,_std::allocator<Remapper::RootConstant>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = 1;
      *(undefined4 *)
       ((long)&(remapper->root_constants).
               super__Vector_base<Remapper::RootConstant,_std::allocator<Remapper::RootConstant>_>.
               _M_impl.super__Vector_impl_data._M_finish + 4) =
           *(undefined4 *)&(vk_binding_local->buffer_binding).bindless.use_heap;
      bVar2 = kind_is_buffer((vk_binding_local->buffer_binding).binding);
      *(uint *)&(remapper->root_constants).
                super__Vector_base<Remapper::RootConstant,_std::allocator<Remapper::RootConstant>_>.
                _M_impl.super__Vector_impl_data._M_finish = (uint)bVar2;
      bVar2 = kind_is_buffer((vk_binding_local->buffer_binding).binding);
      *(uint *)&(remapper->root_constants).
                super__Vector_base<Remapper::RootConstant,_std::allocator<Remapper::RootConstant>_>.
                _M_impl.super__Vector_impl_data._M_start = (uint)bVar2;
      *(undefined4 *)
       ((long)&(remapper->root_constants).
               super__Vector_base<Remapper::RootConstant,_std::allocator<Remapper::RootConstant>_>.
               _M_impl.super__Vector_impl_data._M_start + 4) = 0;
    }
    if (((vk_binding_local->buffer_binding).binding == 0x10) &&
       ((((local_28->bindless & 1U) != 0 || (bVar1)) && ((local_28->ssbo_rtas & 1U) != 0)))) {
      *(undefined4 *)
       ((long)&(remapper->root_constants).
               super__Vector_base<Remapper::RootConstant,_std::allocator<Remapper::RootConstant>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 1;
    }
    if (((local_28->ssbo_srv & 1U) != 0) &&
       (((vk_binding_local->buffer_binding).binding == 0xc ||
        ((vk_binding_local->buffer_binding).binding == 0xb)))) {
      *(undefined4 *)
       ((long)&(remapper->root_constants).
               super__Vector_base<Remapper::RootConstant,_std::allocator<Remapper::RootConstant>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 1;
    }
    remapper->root_constant_word_count = 0xf;
    *(undefined4 *)&remapper->field_0x1c = 0;
  }
  else {
    *(undefined4 *)
     ((long)&(remapper->root_constants).
             super__Vector_base<Remapper::RootConstant,_std::allocator<Remapper::RootConstant>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 3;
    *(int32_t *)
     &(remapper->root_constants).
      super__Vector_base<Remapper::RootConstant,_std::allocator<Remapper::RootConstant>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar3;
  }
  return '\x01';
}

Assistant:

static dxil_spv_bool remap_srv(void *userdata, const dxil_spv_d3d_binding *binding, dxil_spv_srv_vulkan_binding *vk_binding)
{
	auto *remapper = static_cast<Remapper *>(userdata);
	*vk_binding = {};

	int32_t desc_index = find_root_descriptor_index(remapper, binding, DXIL_SPV_RESOURCE_CLASS_SRV);
	if (desc_index >= 0)
	{
		vk_binding->buffer_binding.descriptor_type = DXIL_SPV_VULKAN_DESCRIPTOR_TYPE_BUFFER_DEVICE_ADDRESS;
		vk_binding->buffer_binding.root_constant_index = uint32_t(desc_index);
	}
	else
	{
		bool is_global_heap = d3d_binding_is_global_heap(*binding);

		if (is_global_heap)
		{
			vk_binding->buffer_binding.bindless.use_heap = DXIL_SPV_TRUE;
			vk_binding->buffer_binding.set = 0;
			vk_binding->buffer_binding.binding = 0;
		}
		else if (remapper->bindless)
		{
			vk_binding->buffer_binding.bindless.use_heap = DXIL_SPV_TRUE;
			vk_binding->buffer_binding.bindless.heap_root_offset = binding->register_index;
			vk_binding->buffer_binding.root_constant_index = kind_is_buffer(binding->kind) ? 1 : 0;
			vk_binding->buffer_binding.set = kind_is_buffer(binding->kind) ? 1 : 0;
			vk_binding->buffer_binding.binding = 0;
		}
		else
		{
			vk_binding->buffer_binding.bindless.use_heap = DXIL_SPV_FALSE;
			vk_binding->buffer_binding.set = binding->register_space;
			vk_binding->buffer_binding.binding = binding->register_index;
		}

		if (binding->kind == DXIL_SPV_RESOURCE_KIND_RT_ACCELERATION_STRUCTURE)
			if ((remapper->bindless || is_global_heap) && remapper->ssbo_rtas)
				vk_binding->buffer_binding.descriptor_type = DXIL_SPV_VULKAN_DESCRIPTOR_TYPE_SSBO;

		if (remapper->ssbo_srv)
		{
			if (binding->kind == DXIL_SPV_RESOURCE_KIND_STRUCTURED_BUFFER ||
			    binding->kind == DXIL_SPV_RESOURCE_KIND_RAW_BUFFER)
			{
				vk_binding->buffer_binding.descriptor_type = DXIL_SPV_VULKAN_DESCRIPTOR_TYPE_SSBO;
			}
		}

		// In case it's needed, place offset buffer here.
		vk_binding->offset_binding.set = 15;
		vk_binding->offset_binding.binding = 0;
	}

	return DXIL_SPV_TRUE;
}